

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v4.cpp
# Opt level: O3

void __thiscall
LASreadItemCompressed_POINT14_v4::LASreadItemCompressed_POINT14_v4
          (LASreadItemCompressed_POINT14_v4 *this,ArithmeticDecoder *dec,U32 decompress_selective)

{
  byte bVar1;
  BOOL *pBVar2;
  BOOL *pBVar3;
  long lVar4;
  long lVar5;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015ccb8;
  pBVar2 = &this->contexts[0].last_X_diff_median5[0].high;
  pBVar3 = &this->contexts[0].last_Y_diff_median5[0].high;
  lVar4 = 0xe8;
  do {
    lVar5 = 0;
    do {
      *(undefined8 *)(pBVar2 + lVar5 + -0x14) = 0;
      *(undefined8 *)(pBVar2 + lVar5 + -0x14 + 8) = 0;
      *(undefined4 *)(pBVar2 + lVar5 + -4) = 0;
      pBVar2[lVar5] = true;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x120);
    lVar5 = 0;
    do {
      *(undefined8 *)(pBVar3 + lVar5 + -0x14) = 0;
      *(undefined8 *)(pBVar3 + lVar5 + -0x14 + 8) = 0;
      *(undefined4 *)(pBVar3 + lVar5 + -4) = 0;
      pBVar3[lVar5] = true;
      lVar5 = lVar5 + 0x18;
    } while (lVar5 != 0x120);
    lVar4 = lVar4 + 0xad8;
    pBVar2 = pBVar2 + 0xad8;
    pBVar3 = pBVar3 + 0xad8;
  } while (lVar4 != 0x2c48);
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    memset(&this->instream_channel_returns_XY,0,0x90);
    lVar4 = 0x3e0;
    do {
      *(undefined8 *)
       ((long)&(this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem + lVar4) = 0;
      lVar4 = lVar4 + 0xad8;
    } while (lVar4 != 0x2f40);
    bVar1 = (byte)decompress_selective;
    this->changed_Z = false;
    this->changed_classification = false;
    this->changed_flags = false;
    this->changed_intensity = false;
    this->changed_scan_angle = false;
    this->changed_user_data = false;
    this->changed_point_source = false;
    this->changed_gps_time = false;
    this->num_bytes_channel_returns_XY = 0;
    this->num_bytes_Z = 0;
    this->num_bytes_classification = 0;
    this->num_bytes_flags = 0;
    this->num_bytes_intensity = 0;
    this->num_bytes_scan_angle = 0;
    this->num_bytes_scan_angle = 0;
    this->num_bytes_user_data = 0;
    this->num_bytes_point_source = 0;
    this->num_bytes_gps_time = 0;
    this->requested_Z = (BOOL)(bVar1 & 1);
    this->requested_classification = (BOOL)(bVar1 >> 1 & 1);
    this->requested_flags = (BOOL)(bVar1 >> 2 & 1);
    this->requested_intensity = (BOOL)(bVar1 >> 3 & 1);
    this->requested_scan_angle = (BOOL)(bVar1 >> 4 & 1);
    this->requested_user_data = (BOOL)(bVar1 >> 5 & 1);
    this->requested_point_source = (BOOL)(bVar1 >> 6 & 1);
    this->requested_gps_time = (BOOL)(bVar1 >> 7);
    this->bytes = (U8 *)0x0;
    this->num_bytes_allocated = 0;
    this->current_context = 0;
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v4.cpp"
                ,0x57,
                "LASreadItemCompressed_POINT14_v4::LASreadItemCompressed_POINT14_v4(ArithmeticDecoder *, const U32)"
               );
}

Assistant:

LASreadItemCompressed_POINT14_v4::LASreadItemCompressed_POINT14_v4(ArithmeticDecoder* dec, const U32 decompress_selective)
{
  /* not used as a decoder. just gives access to instream */

  assert(dec);
  this->dec = dec;

  /* zero instreams and decoders */

  instream_channel_returns_XY = 0;
  instream_Z = 0;
  instream_classification = 0;
  instream_flags = 0;
  instream_intensity = 0;
  instream_scan_angle = 0;
  instream_user_data = 0;
  instream_point_source = 0;
  instream_gps_time = 0;

  dec_channel_returns_XY = 0;
  dec_Z = 0;
  dec_classification = 0;
  dec_flags = 0;
  dec_intensity = 0;
  dec_scan_angle = 0;
  dec_user_data = 0;
  dec_point_source = 0;
  dec_gps_time = 0;

  /* mark the four scanner channel contexts as uninitialized */

  U32 c;
  for (c = 0; c < 4; c++)
  {
    contexts[c].m_changed_values[0] = 0;
  }
  current_context = 0;

  /* zero num_bytes and init booleans */

  num_bytes_channel_returns_XY = 0;
  num_bytes_Z = 0;
  num_bytes_classification = 0;
  num_bytes_flags = 0;
  num_bytes_intensity = 0;
  num_bytes_scan_angle = 0;
  num_bytes_user_data = 0;
  num_bytes_point_source = 0;
  num_bytes_gps_time = 0;

  changed_Z = FALSE;
  changed_classification = FALSE;
  changed_flags = FALSE;
  changed_intensity = FALSE;
  changed_scan_angle = FALSE;
  changed_user_data = FALSE;
  changed_point_source = FALSE;
  changed_gps_time = FALSE;

  requested_Z = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_Z ? TRUE : FALSE);
  requested_classification = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_CLASSIFICATION ? TRUE : FALSE);
  requested_flags = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_FLAGS ? TRUE : FALSE);
  requested_intensity = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_INTENSITY ? TRUE : FALSE);
  requested_scan_angle = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_SCAN_ANGLE ? TRUE : FALSE);
  requested_user_data = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_USER_DATA ? TRUE : FALSE);
  requested_point_source = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_POINT_SOURCE ? TRUE : FALSE);
  requested_gps_time = (decompress_selective & LASZIP_DECOMPRESS_SELECTIVE_GPS_TIME ? TRUE : FALSE);

  /* init the bytes buffer to zero */

  bytes = 0;
  num_bytes_allocated = 0;
}